

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

int Mf_CutRef2_rec(Mf_Man_t *p,int *pCut,Vec_Int_t *vTemp,int Limit)

{
  int iVar1;
  int iFunc;
  Mf_Obj_t *pMVar2;
  int *pCut_00;
  int local_34;
  int local_30;
  int Count;
  int i;
  int Limit_local;
  Vec_Int_t *vTemp_local;
  int *pCut_local;
  Mf_Man_t *p_local;
  
  iVar1 = Mf_CutSize(pCut);
  iFunc = Mf_CutFunc(pCut);
  local_34 = Mf_CutArea(p,iVar1,iFunc);
  p_local._4_4_ = local_34;
  if (Limit != 0) {
    for (local_30 = 1; iVar1 = Mf_CutSize(pCut), local_30 <= iVar1; local_30 = local_30 + 1) {
      Vec_IntPush(vTemp,pCut[local_30]);
      iVar1 = Mf_ObjMapRefInc(p,pCut[local_30]);
      if ((iVar1 == 0) && (pMVar2 = Mf_ManObj(p,pCut[local_30]), pMVar2->iCutSet != 0)) {
        pCut_00 = Mf_ObjCutBest(p,pCut[local_30]);
        iVar1 = Mf_CutRef2_rec(p,pCut_00,vTemp,Limit + -1);
        local_34 = iVar1 + local_34;
      }
    }
    p_local._4_4_ = local_34;
  }
  return p_local._4_4_;
}

Assistant:

int Mf_CutRef2_rec( Mf_Man_t * p, int * pCut, Vec_Int_t * vTemp, int Limit )
{
    int i, Count = Mf_CutArea(p, Mf_CutSize(pCut), Mf_CutFunc(pCut));
    if ( Limit == 0 ) return Count;
    for ( i = 1; i <= Mf_CutSize(pCut); i++ )
    {
        Vec_IntPush( vTemp, pCut[i] );
        if ( !Mf_ObjMapRefInc(p, pCut[i]) && Mf_ManObj(p, pCut[i])->iCutSet )
            Count += Mf_CutRef2_rec( p, Mf_ObjCutBest(p, pCut[i]), vTemp, Limit-1 );
    }
    return Count;
}